

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lr0.c
# Opt level: O2

void show_cores(void)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  core *local_50;
  
  local_50 = (core *)&first_state;
  uVar5 = 0;
  while (local_50 = local_50->next, local_50 != (core *)0x0) {
    if ((int)uVar5 != 0) {
      putchar(10);
    }
    printf("state %d, number = %d, accessing symbol = %s\n",uVar5,(ulong)(uint)local_50->number,
           symbol_name[local_50->accessing_symbol]);
    uVar2 = local_50->nitems;
    if (local_50->nitems < 1) {
      uVar2 = 0;
    }
    for (uVar3 = 0; uVar3 != uVar2; uVar3 = uVar3 + 1) {
      uVar1 = local_50->items[uVar3];
      printf("%4d  ",(ulong)uVar1);
      lVar4 = (long)(int)uVar1 * 4;
      do {
        lVar6 = lVar4;
        lVar4 = lVar6 + 4;
      } while (-1 < *(int *)((long)ritem + lVar6));
      printf("%s :",symbol_name[rlhs[(uint)-*(int *)((long)ritem + lVar6)]]);
      lVar6 = (long)rrhs[-(long)*(int *)((long)ritem + lVar6)];
      lVar4 = lVar6 * 4;
      for (; lVar6 < (int)uVar1; lVar6 = lVar6 + 1) {
        printf(" %s",symbol_name[ritem[lVar6]]);
        lVar4 = lVar4 + 4;
      }
      printf(" .");
      for (; -1 < (long)*(int *)((long)ritem + lVar4); lVar4 = lVar4 + 4) {
        printf(" %s",symbol_name[*(int *)((long)ritem + lVar4)]);
      }
      putchar(10);
      fflush(_stdout);
    }
    uVar5 = (ulong)((int)uVar5 + 1);
  }
  return;
}

Assistant:

void show_cores()
{
    core *p;
    int i, j, k, n;
    int itemno;

    k = 0;
    for (p = first_state; p; ++k, p = p->next)
    {
	if (k) printf("\n");
	printf("state %d, number = %d, accessing symbol = %s\n",
		k, p->number, symbol_name[p->accessing_symbol]);
	n = p->nitems;
	for (i = 0; i < n; ++i)
	{
	    itemno = p->items[i];
	    printf("%4d  ", itemno);
	    j = itemno;
	    while (ritem[j] >= 0) ++j;
	    printf("%s :", symbol_name[rlhs[-ritem[j]]]);
	    j = rrhs[-ritem[j]];
	    while (j < itemno)
		printf(" %s", symbol_name[ritem[j++]]);
	    printf(" .");
	    while (ritem[j] >= 0)
		printf(" %s", symbol_name[ritem[j++]]);
	    printf("\n");
	    fflush(stdout);
	}
    }
}